

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9ReachM(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Gia_ParLlb_t Pars;
  char *local_b0;
  Gia_ParLlb_t local_a8;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Llb_ManSetDefaultParams(&local_a8);
  local_b0 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00288a50:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"TBFCHSLripcsyzvwh"), pAbc_00 = local_38,
        iVar3 = globalUtilOptind, 0x53 < iVar1) {
    switch(iVar1) {
    case 0x69:
      local_a8.fIndConstr = local_a8.fIndConstr ^ 1;
      break;
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x74:
    case 0x75:
    case 0x78:
      goto switchD_00288a71_caseD_44;
    case 0x70:
      local_a8.fUsePivots = local_a8.fUsePivots ^ 1;
      break;
    case 0x72:
      local_a8.fReorder = local_a8.fReorder ^ 1;
      break;
    case 0x73:
      local_a8.fSchedule = local_a8.fSchedule ^ 1;
      break;
    case 0x76:
      local_a8.fVerbose = local_a8.fVerbose ^ 1;
      break;
    case 0x77:
      local_a8.fVeryVerbose = local_a8.fVeryVerbose ^ 1;
      break;
    case 0x79:
      local_a8.fSkipOutCheck = local_a8.fSkipOutCheck ^ 1;
      break;
    case 0x7a:
      local_a8.fSkipReach = local_a8.fSkipReach ^ 1;
      break;
    default:
      if (iVar1 != 99) {
        if (iVar1 == 0x54) {
          if (globalUtilOptind < argc) {
            uVar2 = atoi(argv[globalUtilOptind]);
            local_a8.TimeLimit = uVar2;
            goto LAB_00288b4a;
          }
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_00288c5f;
        }
        goto switchD_00288a71_caseD_44;
      }
      local_a8.fCluster = local_a8.fCluster ^ 1;
    }
  }
  switch(iVar1) {
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nBddMax = uVar2;
LAB_00288b4a:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_00288a71_caseD_44:
      Abc_Print(-2,"usage: &reachm [-TBFCHS num] [-L file] [-ripcsyzvwh]\n");
      Abc_Print(-2,
                "\t         model checking via BDD-based reachability (dependence-matrix-based)\n");
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)local_a8.TimeLimit);
      Abc_Print(-2,"\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n",
                (ulong)(uint)local_a8.nBddMax);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)local_a8.nIterMax);
      Abc_Print(-2,"\t-C num : max number of variables in a cluster [default = %d]\n",
                (ulong)(uint)local_a8.nClusterMax);
      Abc_Print(-2,"\t-H num : max number of hints to use [default = %d]\n",
                (ulong)(uint)local_a8.nHintDepth);
      Abc_Print(-2,"\t-S num : the number of the starting hint [default = %d]\n",
                (ulong)(uint)local_a8.HintFirst);
      pcVar4 = "no logging";
      if (local_b0 != (char *)0x0) {
        pcVar4 = local_b0;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar4);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_a8.fReorder == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fIndConstr == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-i     : enable extraction of inductive constraints [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fUsePivots == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p     : enable partitions for internal cut-points [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fCluster == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : enable clustering of partitions [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fSchedule == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : enable scheduling of clusters [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fSkipOutCheck == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a8.fSkipReach == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z     : skip reachability (run preparation phase only) [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a8.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
      if (local_a8.fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : prints dependency matrix [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_00288e72:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
    goto LAB_00288a50;
  case 0x43:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a8.nClusterMax = uVar2;
      goto LAB_00288b4a;
    }
    pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_00288a71_caseD_44;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a8.nIterMax = uVar2;
      goto LAB_00288b4a;
    }
    pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x48:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a8.nHintDepth = uVar2;
      goto LAB_00288b4a;
    }
    pcVar4 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_b0 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00288a50;
    }
    pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  default:
    if (iVar1 != 0x53) {
      if (iVar1 == -1) {
        pGia = local_38->pGia;
        if (pGia != (Gia_Man_t *)0x0) {
          if (pGia->nRegs == 0) {
            Abc_Print(-1,"Abc_CommandAbc9ReachM(): The current AIG has no latches.\n");
            return 0;
          }
          if (0xffff < pGia->nObjs) {
            Abc_Print(-1,
                      "Abc_CommandAbc9ReachM(): Currently cannot handle AIGs with more than %d objects.\n"
                      ,0x10000);
            return 0;
          }
          iVar3 = Llb_ManModelCheckGia(pGia,&local_a8);
          pAbc_00->Status = iVar3;
          pAbc_00->nFrames = local_a8.iFrame;
          Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
          if (local_b0 == (char *)0x0) {
            return 0;
          }
          Abc_NtkWriteLogFile(local_b0,pAbc_00->pCex,pAbc_00->Status,pAbc_00->nFrames,"&reachm");
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9ReachM(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_00288e72;
      }
      goto switchD_00288a71_caseD_44;
    }
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a8.HintFirst = uVar2;
      goto LAB_00288b4a;
    }
    pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
  }
LAB_00288c5f:
  Abc_Print(-1,pcVar4);
  goto switchD_00288a71_caseD_44;
}

Assistant:

int Abc_CommandAbc9ReachM( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_ParLlb_t Pars, * pPars = &Pars;
    char * pLogFileName = NULL;
    int c;
    extern int Llb_ManModelCheckGia( Gia_Man_t * pGia, Gia_ParLlb_t * pPars );

    // set defaults
    Llb_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TBFCHSLripcsyzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nClusterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nClusterMax < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nHintDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nHintDepth < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->HintFirst = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->HintFirst < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'i':
            pPars->fIndConstr ^= 1;
            break;
        case 'p':
            pPars->fUsePivots ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 's':
            pPars->fSchedule ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'z':
            pPars->fSkipReach ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): The current AIG has no latches.\n" );
        return 0;
    }
    if ( Gia_ManObjNum(pAbc->pGia) >= (1<<16) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachM(): Currently cannot handle AIGs with more than %d objects.\n", (1<<16) );
        return 0;
    }
    pAbc->Status  = Llb_ManModelCheckGia( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&reachm" );
    return 0;

usage:
    Abc_Print( -2, "usage: &reachm [-TBFCHS num] [-L file] [-ripcsyzvwh]\n" );
    Abc_Print( -2, "\t         model checking via BDD-based reachability (dependence-matrix-based)\n" );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-C num : max number of variables in a cluster [default = %d]\n", pPars->nClusterMax );
    Abc_Print( -2, "\t-H num : max number of hints to use [default = %d]\n", pPars->nHintDepth );
    Abc_Print( -2, "\t-S num : the number of the starting hint [default = %d]\n", pPars->HintFirst );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-i     : enable extraction of inductive constraints [default = %s]\n", pPars->fIndConstr? "yes": "no" );
    Abc_Print( -2, "\t-p     : enable partitions for internal cut-points [default = %s]\n", pPars->fUsePivots? "yes": "no" );
    Abc_Print( -2, "\t-c     : enable clustering of partitions [default = %s]\n", pPars->fCluster? "yes": "no" );
    Abc_Print( -2, "\t-s     : enable scheduling of clusters [default = %s]\n", pPars->fSchedule? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-z     : skip reachability (run preparation phase only) [default = %s]\n", pPars->fSkipReach? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : prints dependency matrix [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}